

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp_obj.c
# Opt level: O3

rk_s32 kmpp_obj_ioctl(KmppObj obj,rk_s32 cmd,KmppObj in,KmppObj out,char *caller)

{
  uint __fd;
  int iVar1;
  char *fmt;
  KmppObjImpl *impl_in;
  KmppObjImpl *impl_out;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 *local_48;
  uint local_3c;
  KmppObj local_38;
  KmppObjImpl *ioc;
  
  local_38 = (KmppObj)0x0;
  uStack_50 = 0x166662;
  local_3c = kmpp_obj_get_by_name(&local_38,"KmppIoc",caller);
  if (local_3c == 0) {
    uStack_50 = 0x1666a3;
    local_3c = open("/dev/kmpp_ioctl",2);
    if (-1 < (int)local_3c) {
      local_48 = &local_68;
      local_68 = 1;
      local_60 = **(undefined8 **)((long)local_38 + 0x20);
      local_58 = (*(undefined8 **)((long)local_38 + 0x20))[1];
      if ((((byte)kmpp_obj_debug & 0x10) != 0) &&
         (_mpp_log_l(4,"kmpp_obj","ioctl arg %p obj_sptr [u:k] %llx : %llx\n",(char *)0x0,local_48,
                     local_60,local_58), ((byte)kmpp_obj_debug & 0x10) != 0)) {
        _mpp_log_l(4,"kmpp_obj","ioctl def %s - %d cmd %d\n",(char *)0x0,
                   *(undefined8 *)(*(long *)((long)obj + 8) + 0x18),
                   (ulong)*(uint *)(*(long *)((long)obj + 8) + 8),(ulong)(uint)cmd);
      }
      kmpp_obj_set_u32(local_38,"def",*(rk_u32 *)(*(long *)((long)obj + 8) + 8));
      kmpp_obj_set_u32(local_38,"cmd",cmd);
      kmpp_obj_set_u32(local_38,"flag",0);
      kmpp_obj_set_u32(local_38,"id",0);
      if ((in != (KmppObj)0x0) &&
         (kmpp_obj_set_shm(local_38,"in",*(KmppShmPtr **)((long)in + 0x20)),
         ((byte)kmpp_obj_debug & 0x10) != 0)) {
        _mpp_log_l(4,"kmpp_obj","ioctl [u:k] in %#llx : %#llx\n",(char *)0x0,
                   **(undefined8 **)((long)in + 0x20),(*(undefined8 **)((long)in + 0x20))[1]);
      }
      if ((out != (KmppObj)0x0) &&
         (kmpp_obj_set_shm(local_38,"out",*(KmppShmPtr **)((long)out + 0x20)),
         ((byte)kmpp_obj_debug & 0x10) != 0)) {
        _mpp_log_l(4,"kmpp_obj","ioctl [u:k] in %#llx : %#llx\n",(char *)0x0,
                   **(undefined8 **)((long)out + 0x20),(*(undefined8 **)((long)out + 0x20))[1]);
      }
      __fd = local_3c;
      iVar1 = ioctl(local_3c,0,local_48);
      kmpp_obj_put(local_38,caller);
      close(__fd);
      return iVar1;
    }
    fmt = "failed to open /dev/kmpp_ioctl ret %d\n";
  }
  else {
    fmt = "failed to get KmppIoc ret %d\n";
  }
  uStack_50 = 0x166685;
  _mpp_log_l(2,"kmpp_obj",fmt,(char *)0x0,(ulong)local_3c);
  return -1;
}

Assistant:

rk_s32 kmpp_obj_ioctl(KmppObj obj, rk_s32 cmd, KmppObj in, KmppObj out, const char *caller)
{
    KmppObjIocArg *ioc_arg;
    KmppObjImpl *ioc = NULL;
    KmppObjImpl *impl = (KmppObjImpl *)obj;
    rk_s32 ret;
    rk_s32 fd;

    ret = kmpp_obj_get_by_name((KmppObj *)&ioc, "KmppIoc", caller);
    if (ret) {
        mpp_loge("failed to get KmppIoc ret %d\n", ret);
        return rk_nok;
    }

    fd = open("/dev/kmpp_ioctl", O_RDWR);
    if (fd < 0) {
        mpp_loge("failed to open /dev/kmpp_ioctl ret %d\n", fd);
        return rk_nok;
    }

    ioc_arg = alloca(sizeof(KmppObjIocArg) + sizeof(KmppShmPtr));
    ioc_arg->count = 1;
    ioc_arg->flag = 0;
    ioc_arg->obj_sptr[0].uaddr = ioc->shm->uaddr;
    ioc_arg->obj_sptr[0].kaddr = ioc->shm->kaddr;

    obj_dbg_ioctl("ioctl arg %p obj_sptr [u:k] %llx : %llx\n", ioc_arg,
                  ioc_arg->obj_sptr[0].uaddr, ioc_arg->obj_sptr[0].kaddr);

    obj_dbg_ioctl("ioctl def %s - %d cmd %d\n", impl->def->name, impl->def->index, cmd);

    kmpp_obj_set_u32(ioc, "def", impl->def->index);
    kmpp_obj_set_u32(ioc, "cmd", cmd);
    kmpp_obj_set_u32(ioc, "flag", 0);
    kmpp_obj_set_u32(ioc, "id", 0);

    if (in) {
        KmppObjImpl *impl_in = (KmppObjImpl *)in;

        kmpp_obj_set_shm(ioc, "in", impl_in->shm);
        obj_dbg_ioctl("ioctl [u:k] in %#llx : %#llx\n",
                      impl_in->shm->uaddr, impl_in->shm->kaddr);
    }
    if (out) {
        KmppObjImpl *impl_out = (KmppObjImpl *)out;

        kmpp_obj_set_shm(ioc, "out", impl_out->shm);
        obj_dbg_ioctl("ioctl [u:k] in %#llx : %#llx\n",
                      impl_out->shm->uaddr, impl_out->shm->kaddr);
    }

    ret = ioctl(fd, 0, ioc_arg);

    kmpp_obj_put(ioc, caller);

    close(fd);

    return ret;
}